

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketMonitorTests::TestUnsignal_SocketDoesNotExist_WriteSocketErased::RunImpl
          (TestUnsignal_SocketDoesNotExist_WriteSocketErased *this)

{
  undefined1 local_140 [4];
  int socket;
  TestStrategy strategy;
  SocketMonitor monitor;
  TestUnsignal_SocketDoesNotExist_WriteSocketErased *this_local;
  
  FIX::SocketMonitor::SocketMonitor((SocketMonitor *)&strategy.timeoutCount,0);
  TestStrategy::TestStrategy((TestStrategy *)local_140);
  FIX::SocketMonitor::addRead((int)&strategy.timeoutCount);
  FIX::SocketMonitor::addConnect((int)&strategy + 0x18);
  FIX::SocketMonitor::signal((int)&strategy + 0x18);
  FIX::SocketMonitor::unsignal((int)&strategy + 0x18);
  FIX::socket_close(0x65);
  TestStrategy::~TestStrategy((TestStrategy *)local_140);
  FIX::SocketMonitor::~SocketMonitor((SocketMonitor *)&strategy.timeoutCount);
  return;
}

Assistant:

TEST(Unsignal_SocketDoesNotExist_WriteSocketErased)
{
  SocketMonitor monitor;
  TestStrategy strategy;

  int socket = 101;
  monitor.addRead(socket);
  monitor.addConnect(socket);

  monitor.signal(socket);
  monitor.unsignal(socket);

  socket_close(socket);
}